

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O1

Ch __thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::PercentDecodeStream::Take(PercentDecodeStream *this)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  char *pcVar4;
  int iVar5;
  char cVar6;
  
  pcVar4 = this->src_;
  if ((*pcVar4 == '%') && (pcVar4 + 3 <= this->end_)) {
    pcVar4 = pcVar4 + 1;
    this->src_ = pcVar4;
    iVar5 = 1;
    cVar3 = '\0';
    do {
      cVar3 = cVar3 * '\x10';
      cVar1 = *pcVar4;
      cVar6 = -0x30;
      if ((((byte)(cVar1 - 0x30U) < 10) || (cVar6 = -0x37, (byte)(cVar1 + 0xbfU) < 6)) ||
         (cVar6 = -0x57, (byte)(cVar1 + 0x9fU) < 6)) {
        cVar3 = cVar1 + cVar3 + cVar6;
        pcVar4 = pcVar4 + 1;
        this->src_ = pcVar4;
        bVar2 = true;
      }
      else {
        this->valid_ = false;
        bVar2 = false;
      }
      if (!bVar2) goto LAB_00105bf5;
      iVar5 = iVar5 + -1;
    } while (iVar5 == 0);
  }
  else {
    this->valid_ = false;
LAB_00105bf5:
    cVar3 = '\0';
  }
  return cVar3;
}

Assistant:

Ch Take() {
            if (*src_ != '%' || src_ + 3 > end_) { // %XY triplet
                valid_ = false;
                return 0;
            }
            src_++;
            Ch c = 0;
            for (int j = 0; j < 2; j++) {
                c = static_cast<Ch>(c << 4);
                Ch h = *src_;
                if      (h >= '0' && h <= '9') c = static_cast<Ch>(c + h - '0');
                else if (h >= 'A' && h <= 'F') c = static_cast<Ch>(c + h - 'A' + 10);
                else if (h >= 'a' && h <= 'f') c = static_cast<Ch>(c + h - 'a' + 10);
                else {
                    valid_ = false;
                    return 0;
                }
                src_++;
            }
            return c;
        }